

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_40f4ea::ContentProvider::provideStreamData
          (ContentProvider *this,QPDFObjGen *param_1,Pipeline *p)

{
  allocator<char> local_101;
  string local_100 [32];
  QPDFObjectHandle local_e0;
  undefined1 local_d0 [8];
  string all_description;
  QPDFObjGen local_a0;
  string local_98;
  undefined1 local_78 [8];
  string description;
  Pl_Concatenate concat;
  Pipeline *p_local;
  QPDFObjGen *param_1_local;
  ContentProvider *this_local;
  
  Pl_Concatenate::Pl_Concatenate((Pl_Concatenate *)((long)&description.field_2 + 8),"concatenate",p)
  ;
  local_a0 = QPDFObjectHandle::getObjGen(&this->from_page);
  QPDFObjGen::unparse_abi_cxx11_(&local_98,&local_a0,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "contents from page object ",&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"/Contents",&local_101);
  QPDFObjectHandle::getKey(&local_e0,(string *)&this->from_page);
  QPDFObjectHandle::pipeContentStreams
            (&local_e0,(Pipeline *)((long)&description.field_2 + 8),(string *)local_78,
             (string *)local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  Pl_Concatenate::manualFinish((Pl_Concatenate *)((long)&description.field_2 + 8));
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_78);
  Pl_Concatenate::~Pl_Concatenate((Pl_Concatenate *)((long)&description.field_2 + 8));
  return;
}

Assistant:

void
ContentProvider::provideStreamData(QPDFObjGen const&, Pipeline* p)
{
    Pl_Concatenate concat("concatenate", p);
    std::string description = "contents from page object " + from_page.getObjGen().unparse(' ');
    std::string all_description;
    from_page.getKey("/Contents").pipeContentStreams(&concat, description, all_description);
    concat.manualFinish();
}